

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertFromStruct
          (JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *this,
          vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *list)

{
  bool bVar1;
  PsbtBip32Data *in_RDI;
  PsbtBip32Data object;
  PsbtBip32DataStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *__range3;
  PsbtBip32DataStruct *in_stack_fffffffffffffef8;
  value_type *in_stack_ffffffffffffff08;
  vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
  *in_stack_ffffffffffffff10;
  PsbtBip32Data *in_stack_ffffffffffffff60;
  __normal_iterator<const_PsbtBip32DataStruct_*,_std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (PsbtBip32DataStruct *)
       ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::begin
                 (in_stack_fffffffffffffef8);
  ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::end
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)
             in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PsbtBip32DataStruct_*,_std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_PsbtBip32DataStruct_*,_std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_PsbtBip32DataStruct_*,_std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffef8 = (PsbtBip32DataStruct *)&stack0xffffffffffffff18;
    cfd::api::json::PsbtBip32Data::PsbtBip32Data(in_stack_ffffffffffffff60);
    cfd::api::json::PsbtBip32Data::ConvertFromStruct(in_RDI,in_stack_fffffffffffffef8);
    ::std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>::
    push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    cfd::api::json::PsbtBip32Data::~PsbtBip32Data(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_PsbtBip32DataStruct_*,_std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }